

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O2

DFA * __thiscall re2::Prog::GetDFA(Prog *this,MatchKind kind)

{
  bool bVar1;
  long lVar2;
  DFA *this_00;
  long max_mem;
  long lVar3;
  
  lVar3 = 0x88;
  if ((kind != kFirstMatch) && (kind != kManyMatch)) {
    kind = kLongestMatch;
    lVar3 = 0x90;
  }
  this_00 = *(DFA **)((long)this->inst_count_ + lVar3 + -0x28);
  if (this_00 == (DFA *)0x0) {
    Mutex::Lock(&this->dfa_mutex_);
    this_00 = *(DFA **)((long)this->inst_count_ + lVar3 + -0x28);
    if (this_00 == (DFA *)0x0) {
      lVar2 = this->dfa_mem_;
      bVar1 = this->reversed_;
      this_00 = (DFA *)operator_new(0x170);
      max_mem = 0;
      if ((kind & kLongestMatch) != kFirstMatch) {
        max_mem = lVar2;
      }
      if (bVar1 == false) {
        max_mem = lVar2 / 2;
      }
      DFA::DFA(this_00,this,kind,max_mem);
      *(DFA **)((long)this->inst_count_ + lVar3 + -0x28) = this_00;
    }
    Mutex::Unlock(&this->dfa_mutex_);
  }
  return this_00;
}

Assistant:

DFA* Prog::GetDFA(MatchKind kind) {
  std::atomic<DFA*>* pdfa;
  if (kind == kFirstMatch || kind == kManyMatch) {
    pdfa = &dfa_first_;
  } else {
    kind = kLongestMatch;
    pdfa = &dfa_longest_;
  }

  // Quick check.
  DFA* dfa = pdfa->load(std::memory_order_acquire);
  if (dfa != NULL)
    return dfa;

  MutexLock l(&dfa_mutex_);
  dfa = pdfa->load(std::memory_order_relaxed);
  if (dfa != NULL)
    return dfa;

  // For a forward DFA, half the memory goes to each DFA.
  // For a reverse DFA, all the memory goes to the
  // "longest match" DFA, because RE2 never does reverse
  // "first match" searches.
  int64 m = dfa_mem_/2;
  if (reversed_) {
    if (kind == kLongestMatch || kind == kManyMatch)
      m = dfa_mem_;
    else
      m = 0;
  }
  dfa = new DFA(this, kind, m);

  // Synchronize with "quick check" above.
  pdfa->store(dfa, std::memory_order_release);
  return dfa;
}